

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void attachFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  Btree **ppBtree;
  int *piVar1;
  uint uVar2;
  sqlite3 *db;
  Db *pDVar3;
  Pager *pPVar4;
  Btree *pBVar5;
  char *pcVar6;
  Btree *pBVar7;
  Schema *pSVar8;
  u8 uVar9;
  undefined6 uVar10;
  u8 uVar11;
  u8 uVar12;
  undefined6 uVar13;
  int iVar14;
  int iVar15;
  char *pcVar16;
  char *zRight;
  Db *pDVar17;
  Schema *pSVar18;
  long lVar19;
  char *zErrDyn;
  uint flags;
  char *zErr;
  char *zPath;
  sqlite3_vfs *pVfs;
  char *local_68;
  Btree *local_60;
  uint local_54;
  char *local_50;
  char *local_48;
  char *local_40;
  sqlite3_vfs *local_38;
  
  db = context->pOut->db;
  iVar14 = 0;
  local_40 = (char *)0x0;
  local_48 = (char *)0x0;
  local_68 = (char *)0x0;
  pcVar16 = (char *)sqlite3ValueText(*argv,'\x01');
  zRight = (char *)sqlite3ValueText(argv[1],'\x01');
  if (pcVar16 == (char *)0x0) {
    pcVar16 = "";
  }
  if (zRight == (char *)0x0) {
    zRight = "";
  }
  uVar2 = db->nDb;
  if ((int)uVar2 < db->aLimit[7] + 2) {
    if (db->autoCommit == '\0') {
      pcVar16 = "cannot ATTACH database within transaction";
      iVar14 = 0;
LAB_002518e4:
      local_68 = sqlite3MPrintf(db,pcVar16);
      goto LAB_002518f2;
    }
    pDVar17 = db->aDb;
    local_60 = (Btree *)context;
    local_50 = pcVar16;
    if (0 < (int)uVar2) {
      lVar19 = 0;
      do {
        iVar14 = sqlite3StrICmp(*(char **)((long)&pDVar17->zDbSName + lVar19),zRight);
        if (iVar14 == 0) {
          iVar14 = 0;
          local_68 = sqlite3MPrintf(db,"database %s is already in use",zRight);
          context = (sqlite3_context *)local_60;
          goto LAB_002518f2;
        }
        lVar19 = lVar19 + 0x20;
      } while ((ulong)uVar2 << 5 != lVar19);
    }
    if (pDVar17 == db->aDbStatic) {
      pDVar17 = (Db *)sqlite3DbMallocRawNN(db,0x60);
      if (pDVar17 == (Db *)0x0) {
        return;
      }
      pDVar3 = db->aDb;
      pcVar16 = pDVar3->zDbSName;
      pBVar5 = pDVar3->pBt;
      uVar11 = pDVar3->safety_level;
      uVar12 = pDVar3->bSyncSet;
      uVar13 = *(undefined6 *)&pDVar3->field_0x12;
      pSVar18 = pDVar3->pSchema;
      pcVar6 = pDVar3[1].zDbSName;
      pBVar7 = pDVar3[1].pBt;
      uVar9 = pDVar3[1].bSyncSet;
      uVar10 = *(undefined6 *)&pDVar3[1].field_0x12;
      pSVar8 = pDVar3[1].pSchema;
      pDVar17[1].safety_level = pDVar3[1].safety_level;
      pDVar17[1].bSyncSet = uVar9;
      *(undefined6 *)&pDVar17[1].field_0x12 = uVar10;
      pDVar17[1].pSchema = pSVar8;
      pDVar17[1].zDbSName = pcVar6;
      pDVar17[1].pBt = pBVar7;
      pDVar17->safety_level = uVar11;
      pDVar17->bSyncSet = uVar12;
      *(undefined6 *)&pDVar17->field_0x12 = uVar13;
      pDVar17->pSchema = pSVar18;
      pDVar17->zDbSName = pcVar16;
      pDVar17->pBt = pBVar5;
    }
    else {
      pDVar17 = (Db *)sqlite3DbRealloc(db,pDVar17,(long)(int)uVar2 * 0x20 + 0x20);
      if (pDVar17 == (Db *)0x0) {
        return;
      }
    }
    context = (sqlite3_context *)local_60;
    db->aDb = pDVar17;
    iVar14 = db->nDb;
    pDVar3 = pDVar17 + iVar14;
    pDVar3->safety_level = '\0';
    pDVar3->bSyncSet = '\0';
    *(undefined6 *)&pDVar3->field_0x12 = 0;
    *(Schema **)(&pDVar3->safety_level + 8) = (Schema *)0x0;
    pDVar17[iVar14].zDbSName = (char *)0x0;
    pDVar17[iVar14].pBt = (Btree *)0x0;
    local_54 = db->openFlags;
    iVar15 = sqlite3ParseUri(db->pVfs->zName,local_50,&local_54,&local_38,&local_40,&local_48);
    pcVar6 = local_40;
    pcVar16 = local_48;
    if (iVar15 != 0) {
      if (((iVar15 == 7) && (db->mallocFailed == '\0')) && (db->bBenignMalloc == '\0')) {
        db->mallocFailed = '\x01';
        if (0 < db->nVdbeExec) {
          (db->u1).isInterrupted = 1;
        }
        (db->lookaside).bDisable = (db->lookaside).bDisable + 1;
      }
      *(int *)((long)&((Btree *)context)->pNext + 4) = 1;
      *(u8 *)((long)&((Btree *)context)->pPrev + 1) = '\x01';
      sqlite3VdbeMemSetStr
                ((Mem *)((Btree *)context)->db,local_48,-1,'\x01',
                 (_func_void_void_ptr *)0xffffffffffffffff);
      sqlite3_free(pcVar16);
      return;
    }
    pDVar17 = pDVar17 + iVar14;
    local_54 = local_54 | 0x100;
    ppBtree = &pDVar17->pBt;
    iVar15 = sqlite3BtreeOpen(local_38,local_40,db,ppBtree,0,local_54);
    sqlite3_free(pcVar6);
    db->nDb = db->nDb + 1;
    db->skipBtreeMutex = '\0';
    if (iVar15 == 0) {
      pSVar18 = sqlite3SchemaGet(db,pDVar17->pBt);
      pDVar17->pSchema = pSVar18;
      if (pSVar18 == (Schema *)0x0) {
        iVar15 = 7;
      }
      else {
        iVar15 = 0;
        if ((pSVar18->file_format != '\0') && (pSVar18->enc != db->enc)) {
          local_68 = sqlite3MPrintf(db,
                                    "attached databases must use the same text encoding as main database"
                                   );
          iVar15 = 1;
        }
      }
      sqlite3BtreeEnter(*ppBtree);
      local_60 = *ppBtree;
      pPVar4 = local_60->pBt->pPager;
      if (pPVar4->tempFile == '\0') {
        if ((pPVar4->pWal == (Wal *)0x0) || (pPVar4->pWal->exclusiveMode != '\x02')) {
          pPVar4->exclusiveMode = db->dfltLockMode;
        }
      }
      iVar14 = sqlite3BtreeSecureDelete(db->aDb->pBt,-1);
      sqlite3BtreeSecureDelete(local_60,iVar14);
      sqlite3BtreeSetPagerFlags(*ppBtree,db->flags & 0x38U | 3);
      pBVar5 = *ppBtree;
      if (pBVar5->sharable != '\0') {
        piVar1 = &pBVar5->wantToLock;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          unlockBtreeMutex(pBVar5);
        }
      }
    }
    else if (iVar15 == 0x13) {
      local_68 = sqlite3MPrintf(db,"database is already attached");
      iVar15 = 1;
    }
    pDVar17->safety_level = '\x03';
    pcVar16 = sqlite3DbStrDup(db,zRight);
    pDVar17->zDbSName = pcVar16;
    iVar14 = 7;
    if (pcVar16 != (char *)0x0) {
      iVar14 = 0;
    }
    if (iVar15 != 0) {
      iVar14 = iVar15;
    }
    if (iVar14 == 0) {
      if (db->skipBtreeMutex == '\0') {
        btreeEnterAll(db);
      }
      iVar14 = sqlite3Init(db,&local_68);
      if (db->skipBtreeMutex == '\0') {
        btreeLeaveAll(db);
      }
      if (iVar14 == 0) {
        return;
      }
    }
    lVar19 = (long)db->nDb + -1;
    pBVar5 = db->aDb[lVar19].pBt;
    if (pBVar5 != (Btree *)0x0) {
      sqlite3BtreeClose(pBVar5);
      pDVar17 = db->aDb;
      pDVar17[lVar19].pBt = (Btree *)0x0;
      pDVar17[lVar19].pSchema = (Schema *)0x0;
    }
    sqlite3ResetAllSchemasOfConnection(db);
    db->nDb = (int)lVar19;
    if ((iVar14 == 0xc0a) || (iVar14 == 7)) {
      if ((db->mallocFailed == '\0') && (db->bBenignMalloc == '\0')) {
        db->mallocFailed = '\x01';
        if (0 < db->nVdbeExec) {
          (db->u1).isInterrupted = 1;
        }
        (db->lookaside).bDisable = (db->lookaside).bDisable + 1;
      }
      if (local_68 != (char *)0x0) {
        sqlite3DbFreeNN(db,local_68);
      }
      pcVar16 = "out of memory";
      goto LAB_002518e4;
    }
    if (local_68 == (char *)0x0) {
      local_68 = sqlite3MPrintf(db,"unable to open database: %s",local_50);
      goto LAB_002518f2;
    }
  }
  else {
    local_68 = sqlite3MPrintf(db,"too many attached databases - max %d");
LAB_002518f2:
    if (local_68 == (char *)0x0) goto LAB_00251931;
  }
  *(int *)((long)&((Btree *)context)->pNext + 4) = 1;
  *(u8 *)((long)&((Btree *)context)->pPrev + 1) = '\x01';
  sqlite3VdbeMemSetStr
            ((Mem *)((Btree *)context)->db,local_68,-1,'\x01',
             (_func_void_void_ptr *)0xffffffffffffffff);
  if (local_68 != (char *)0x0) {
    sqlite3DbFreeNN(db,local_68);
  }
LAB_00251931:
  if (iVar14 != 0) {
    sqlite3_result_error_code(context,iVar14);
  }
  return;
}

Assistant:

static void attachFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  int i;
  int rc = 0;
  sqlite3 *db = sqlite3_context_db_handle(context);
  const char *zName;
  const char *zFile;
  char *zPath = 0;
  char *zErr = 0;
  unsigned int flags;
  Db *aNew;                 /* New array of Db pointers */
  Db *pNew;                 /* Db object for the newly attached database */
  char *zErrDyn = 0;
  sqlite3_vfs *pVfs;

  UNUSED_PARAMETER(NotUsed);

  zFile = (const char *)sqlite3_value_text(argv[0]);
  zName = (const char *)sqlite3_value_text(argv[1]);
  if( zFile==0 ) zFile = "";
  if( zName==0 ) zName = "";

  /* Check for the following errors:
  **
  **     * Too many attached databases,
  **     * Transaction currently open
  **     * Specified database name already being used.
  */
  if( db->nDb>=db->aLimit[SQLITE_LIMIT_ATTACHED]+2 ){
    zErrDyn = sqlite3MPrintf(db, "too many attached databases - max %d", 
      db->aLimit[SQLITE_LIMIT_ATTACHED]
    );
    goto attach_error;
  }
  if( !db->autoCommit ){
    zErrDyn = sqlite3MPrintf(db, "cannot ATTACH database within transaction");
    goto attach_error;
  }
  for(i=0; i<db->nDb; i++){
    char *z = db->aDb[i].zDbSName;
    assert( z && zName );
    if( sqlite3StrICmp(z, zName)==0 ){
      zErrDyn = sqlite3MPrintf(db, "database %s is already in use", zName);
      goto attach_error;
    }
  }

  /* Allocate the new entry in the db->aDb[] array and initialize the schema
  ** hash tables.
  */
  if( db->aDb==db->aDbStatic ){
    aNew = sqlite3DbMallocRawNN(db, sizeof(db->aDb[0])*3 );
    if( aNew==0 ) return;
    memcpy(aNew, db->aDb, sizeof(db->aDb[0])*2);
  }else{
    aNew = sqlite3DbRealloc(db, db->aDb, sizeof(db->aDb[0])*(db->nDb+1) );
    if( aNew==0 ) return;
  }
  db->aDb = aNew;
  pNew = &db->aDb[db->nDb];
  memset(pNew, 0, sizeof(*pNew));

  /* Open the database file. If the btree is successfully opened, use
  ** it to obtain the database schema. At this point the schema may
  ** or may not be initialized.
  */
  flags = db->openFlags;
  rc = sqlite3ParseUri(db->pVfs->zName, zFile, &flags, &pVfs, &zPath, &zErr);
  if( rc!=SQLITE_OK ){
    if( rc==SQLITE_NOMEM ) sqlite3OomFault(db);
    sqlite3_result_error(context, zErr, -1);
    sqlite3_free(zErr);
    return;
  }
  assert( pVfs );
  flags |= SQLITE_OPEN_MAIN_DB;
  rc = sqlite3BtreeOpen(pVfs, zPath, db, &pNew->pBt, 0, flags);
  sqlite3_free( zPath );
  db->nDb++;
  db->skipBtreeMutex = 0;
  if( rc==SQLITE_CONSTRAINT ){
    rc = SQLITE_ERROR;
    zErrDyn = sqlite3MPrintf(db, "database is already attached");
  }else if( rc==SQLITE_OK ){
    Pager *pPager;
    pNew->pSchema = sqlite3SchemaGet(db, pNew->pBt);
    if( !pNew->pSchema ){
      rc = SQLITE_NOMEM_BKPT;
    }else if( pNew->pSchema->file_format && pNew->pSchema->enc!=ENC(db) ){
      zErrDyn = sqlite3MPrintf(db, 
        "attached databases must use the same text encoding as main database");
      rc = SQLITE_ERROR;
    }
    sqlite3BtreeEnter(pNew->pBt);
    pPager = sqlite3BtreePager(pNew->pBt);
    sqlite3PagerLockingMode(pPager, db->dfltLockMode);
    sqlite3BtreeSecureDelete(pNew->pBt,
                             sqlite3BtreeSecureDelete(db->aDb[0].pBt,-1) );
#ifndef SQLITE_OMIT_PAGER_PRAGMAS
    sqlite3BtreeSetPagerFlags(pNew->pBt,
                      PAGER_SYNCHRONOUS_FULL | (db->flags & PAGER_FLAGS_MASK));
#endif
    sqlite3BtreeLeave(pNew->pBt);
  }
  pNew->safety_level = SQLITE_DEFAULT_SYNCHRONOUS+1;
  pNew->zDbSName = sqlite3DbStrDup(db, zName);
  if( rc==SQLITE_OK && pNew->zDbSName==0 ){
    rc = SQLITE_NOMEM_BKPT;
  }


#ifdef SQLITE_HAS_CODEC
  if( rc==SQLITE_OK ){
    extern int sqlite3CodecAttach(sqlite3*, int, const void*, int);
    extern void sqlite3CodecGetKey(sqlite3*, int, void**, int*);
    int nKey;
    char *zKey;
    int t = sqlite3_value_type(argv[2]);
    switch( t ){
      case SQLITE_INTEGER:
      case SQLITE_FLOAT:
        zErrDyn = sqlite3DbStrDup(db, "Invalid key value");
        rc = SQLITE_ERROR;
        break;
        
      case SQLITE_TEXT:
      case SQLITE_BLOB:
        nKey = sqlite3_value_bytes(argv[2]);
        zKey = (char *)sqlite3_value_blob(argv[2]);
        rc = sqlite3CodecAttach(db, db->nDb-1, zKey, nKey);
        break;

      case SQLITE_NULL:
        /* No key specified.  Use the key from the main database */
        sqlite3CodecGetKey(db, 0, (void**)&zKey, &nKey);
        if( nKey || sqlite3BtreeGetOptimalReserve(db->aDb[0].pBt)>0 ){
          rc = sqlite3CodecAttach(db, db->nDb-1, zKey, nKey);
        }
        break;
    }
  }
#endif

  /* If the file was opened successfully, read the schema for the new database.
  ** If this fails, or if opening the file failed, then close the file and 
  ** remove the entry from the db->aDb[] array. i.e. put everything back the way
  ** we found it.
  */
  if( rc==SQLITE_OK ){
    sqlite3BtreeEnterAll(db);
    rc = sqlite3Init(db, &zErrDyn);
    sqlite3BtreeLeaveAll(db);
  }
#ifdef SQLITE_USER_AUTHENTICATION
  if( rc==SQLITE_OK ){
    u8 newAuth = 0;
    rc = sqlite3UserAuthCheckLogin(db, zName, &newAuth);
    if( newAuth<db->auth.authLevel ){
      rc = SQLITE_AUTH_USER;
    }
  }
#endif
  if( rc ){
    int iDb = db->nDb - 1;
    assert( iDb>=2 );
    if( db->aDb[iDb].pBt ){
      sqlite3BtreeClose(db->aDb[iDb].pBt);
      db->aDb[iDb].pBt = 0;
      db->aDb[iDb].pSchema = 0;
    }
    sqlite3ResetAllSchemasOfConnection(db);
    db->nDb = iDb;
    if( rc==SQLITE_NOMEM || rc==SQLITE_IOERR_NOMEM ){
      sqlite3OomFault(db);
      sqlite3DbFree(db, zErrDyn);
      zErrDyn = sqlite3MPrintf(db, "out of memory");
    }else if( zErrDyn==0 ){
      zErrDyn = sqlite3MPrintf(db, "unable to open database: %s", zFile);
    }
    goto attach_error;
  }
  
  return;

attach_error:
  /* Return an error if we get here */
  if( zErrDyn ){
    sqlite3_result_error(context, zErrDyn, -1);
    sqlite3DbFree(db, zErrDyn);
  }
  if( rc ) sqlite3_result_error_code(context, rc);
}